

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_utils.c
# Opt level: O0

HPDF_UINT HPDF_StrLen(char *s,HPDF_INT maxlen)

{
  bool local_22;
  HPDF_UINT local_20;
  HPDF_INT len;
  HPDF_INT maxlen_local;
  char *s_local;
  
  local_20 = 0;
  _len = s;
  if (s == (char *)0x0) {
    s_local._4_4_ = 0;
  }
  else {
    while( true ) {
      local_22 = false;
      if (*_len != '\0') {
        local_22 = maxlen < 0 || (int)local_20 < maxlen;
      }
      if (!local_22) break;
      _len = _len + 1;
      local_20 = local_20 + 1;
    }
    s_local._4_4_ = local_20;
  }
  return s_local._4_4_;
}

Assistant:

HPDF_UINT
HPDF_StrLen  (const char   *s,
              HPDF_INT      maxlen)
{
    HPDF_INT len = 0;

    if (!s)
        return 0;

    while (*s != 0 && (maxlen < 0 || len < maxlen)) {
        s++;
        len++;
    }

    return (HPDF_UINT)len;
}